

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.cpp
# Opt level: O1

convertable * __thiscall
mpt::node_relation::find(node_relation *this,type_t type,char *name,int nlen)

{
  node *pnVar1;
  convertable *pcVar2;
  relation *prVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  convertable *local_38;
  
  sVar7 = CONCAT44(in_register_0000000c,nlen);
  pnVar1 = this->_curr;
  if (pnVar1 != (node *)0x0) {
    if (nlen < 0) {
      if (name == (char *)0x0) {
        sVar7 = 0;
      }
      else {
        sVar7 = strlen(name);
      }
    }
    for (pnVar1 = pnVar1->children; pnVar1 != (node *)0x0; pnVar1 = pnVar1->next) {
      pcVar2 = &pnVar1->_meta->super_convertable;
      bVar4 = true;
      if (((pcVar2 != (convertable *)0x0) &&
          ((name == (char *)0x0 ||
           (bVar5 = identifier::equal(&pnVar1->ident,name,(int)sVar7), bVar5)))) &&
         ((type == 0 || (iVar6 = (**pcVar2->_vptr_convertable)(pcVar2,type,0), -1 < iVar6)))) {
        bVar4 = false;
        local_38 = pcVar2;
      }
      if (!bVar4) break;
    }
    if (pnVar1 != (node *)0x0) {
      return local_38;
    }
    prVar3 = this->_parent;
    if (prVar3 != (relation *)0x0) {
      iVar6 = (**prVar3->_vptr_relation)(prVar3,type,name,sVar7);
      return (convertable *)CONCAT44(extraout_var,iVar6);
    }
  }
  return (convertable *)0x0;
}

Assistant:

convertable *node_relation::find(type_t type, const char *name, int nlen) const
{
	if (!_curr) {
		return 0;
	}
	if (nlen < 0) nlen = name ? strlen(name) : 0;

	for (const node *c = _curr->children; c; c = c->next) {
		metatype *m;
		if (!(m = c->_meta)) {
			continue;
		}
		if (name && !c->ident.equal(name, nlen)) {
			continue;
		}
		// optional type restriction
		if (type && m->convert(type, 0) < 0) {
			continue;
		}
		return m;
	}
	return _parent ? _parent->find(type, name, nlen) : 0;
}